

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O2

Function * __thiscall camp::Class::function(Class *this,size_t index)

{
  OutOfRange *__return_storage_ptr__;
  allocator local_aa;
  allocator local_a9;
  string local_a8;
  string local_88;
  OutOfRange local_68;
  
  if (index < (this->m_functions).node_count) {
    return (Function *)(this->m_functions).super_type.ptrs.spc.data_[index][-5].up_;
  }
  __return_storage_ptr__ = (OutOfRange *)__cxa_allocate_exception(0x48);
  OutOfRange::OutOfRange(&local_68,index,(this->m_functions).node_count);
  std::__cxx11::string::string
            ((string *)&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/class.cpp"
             ,&local_a9);
  std::__cxx11::string::string
            ((string *)&local_a8,"const Function &camp::Class::function(std::size_t) const",
             &local_aa);
  Error::prepare<camp::OutOfRange>(__return_storage_ptr__,&local_68,&local_88,0x50,&local_a8);
  __cxa_throw(__return_storage_ptr__,&OutOfRange::typeinfo,Error::~Error);
}

Assistant:

const Function& Class::function(std::size_t index) const
{
    // Make sure that the index is not out of range
    if (index >= m_functions.size())
        CAMP_ERROR(OutOfRange(index, m_functions.size()));

    return *m_functions[index];
}